

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O0

void __thiscall
rsg::ExecutionContext::andExecutionMask(ExecutionContext *this,ExecConstValueAccess value)

{
  bool bVar1;
  bool *pbVar2;
  bool local_161;
  int local_144;
  undefined1 auStack_140 [4];
  int i;
  ExecConstValueAccess oldValue;
  ExecValueAccess newValue;
  ExecMaskStorage tmp;
  ExecutionContext *this_local;
  ExecConstValueAccess value_local;
  
  value_local.m_type = (VariableType *)value.m_value;
  this_local = (ExecutionContext *)value.m_type;
  ExecMaskStorage::ExecMaskStorage
            ((ExecMaskStorage *)&newValue.super_ConstStridedValueAccess<64>.m_value,true);
  join_0x00000010_0x00000000_ =
       (ConstStridedValueAccess<64>)
       ExecMaskStorage::getValue
                 ((ExecMaskStorage *)&newValue.super_ConstStridedValueAccess<64>.m_value);
  _auStack_140 = getExecutionMask(this);
  for (local_144 = 0; local_144 < 0x40; local_144 = local_144 + 1) {
    bVar1 = ConstStridedValueAccess<64>::asBool
                      ((ConstStridedValueAccess<64> *)auStack_140,local_144);
    local_161 = false;
    if (bVar1) {
      local_161 = ConstStridedValueAccess<64>::asBool
                            ((ConstStridedValueAccess<64> *)&this_local,local_144);
    }
    pbVar2 = StridedValueAccess<64>::asBool((StridedValueAccess<64> *)&oldValue.m_value,local_144);
    *pbVar2 = local_161;
  }
  pushExecutionMask(this,stack0xfffffffffffffed0);
  return;
}

Assistant:

void ExecutionContext::andExecutionMask (ExecConstValueAccess value)
{
	ExecMaskStorage			tmp;
	ExecValueAccess			newValue	= tmp.getValue();
	ExecConstValueAccess	oldValue	= getExecutionMask();

	for (int i = 0; i < EXEC_VEC_WIDTH; i++)
		newValue.asBool(i) = oldValue.asBool(i) && value.asBool(i);

	pushExecutionMask(newValue);
}